

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FileStream.cpp
# Opt level: O0

TFileStream * Block4Stream_Open(TCHAR *szFileName,DWORD dwStreamFlags)

{
  bool bVar1;
  uint uVar2;
  char *__s;
  uint local_64;
  int nSuffix;
  DWORD dwBaseFlags;
  DWORD dwBaseFiles;
  size_t nNameLength;
  TCHAR *szNameBuff;
  TBlockStream *pStream;
  ULONGLONG FileSize;
  ULONGLONG BlockCount;
  ULONGLONG RemainderBlock;
  TBaseProviderData *NewBaseArray;
  TCHAR *pTStack_18;
  DWORD dwStreamFlags_local;
  TCHAR *szFileName_local;
  
  RemainderBlock = 0;
  nSuffix = 0;
  NewBaseArray._4_4_ = dwStreamFlags;
  pTStack_18 = szFileName;
  szNameBuff = (TCHAR *)AllocateFileStream(szFileName,0x100,dwStreamFlags);
  if ((TFileStream *)szNameBuff == (TFileStream *)0x0) {
    szFileName_local = (TCHAR *)0x0;
  }
  else {
    if (((TFileStream *)szNameBuff)->BaseOpen == (STREAM_OPEN)0x0) {
      __assert_fail("pStream->BaseOpen != NULL",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Qartar[P]CascLibPlus/lib/CascLib/src/common/FileStream.cpp"
                    ,0x8bf,"TFileStream *Block4Stream_Open(const TCHAR *, DWORD)");
    }
    _dwBaseFlags = strlen(((TFileStream *)szNameBuff)->szFileName);
    if ((((TFileStream *)szNameBuff)->szFileName[_dwBaseFlags - 2] == '.') &&
       (((TFileStream *)szNameBuff)->szFileName[_dwBaseFlags - 1] == '0')) {
      _dwBaseFlags = _dwBaseFlags - 2;
    }
    ((TFileStream *)szNameBuff)->szFileName[_dwBaseFlags] = '\0';
    ((TFileStream *)szNameBuff)->StreamRead = BlockStream_Read;
    ((TFileStream *)szNameBuff)->StreamGetSize = BlockStream_GetSize;
    ((TFileStream *)szNameBuff)->StreamGetPos = BlockStream_GetPos;
    ((TFileStream *)szNameBuff)->StreamClose = Block4Stream_Close;
    ((TFileStream *)szNameBuff)->BlockRead = Block4Stream_BlockRead;
    __s = (char *)malloc(_dwBaseFlags + 4);
    if (__s != (char *)0x0) {
      uVar2 = NewBaseArray._4_4_ & 0xff;
      for (local_64 = 0; (int)local_64 < 0x1e; local_64 = local_64 + 1) {
        sprintf(__s,"%s.%u",((TFileStream *)szNameBuff)->szFileName,(ulong)local_64);
        bVar1 = (*((TFileStream *)szNameBuff)->BaseOpen)
                          ((TFileStream *)szNameBuff,__s,uVar2 | 0x100);
        if (!bVar1) break;
        RemainderBlock = (ULONGLONG)malloc((ulong)(nSuffix + 1) * 0x28);
        if ((void *)RemainderBlock == (void *)0x0) {
          SetLastError(0xc);
          return (TFileStream *)0x0;
        }
        if (((TFileStream *)((long)szNameBuff + 0xd0))->StreamWrite != (STREAM_WRITE)0x0) {
          memcpy((void *)RemainderBlock,((TFileStream *)((long)szNameBuff + 0xd0))->StreamWrite,
                 (ulong)(uint)nSuffix * 0x28);
          free(((TFileStream *)((long)szNameBuff + 0xd0))->StreamWrite);
        }
        memcpy((void *)(RemainderBlock + (ulong)(uint)nSuffix * 0x28),
               &((TFileStream *)szNameBuff)->Base,0x28);
        ((TFileStream *)((long)szNameBuff + 0xd0))->StreamWrite = (STREAM_WRITE)RemainderBlock;
        nSuffix = nSuffix + 1;
        (*((TFileStream *)szNameBuff)->BaseGetSize)((TFileStream *)szNameBuff,(ULONGLONG *)&pStream)
        ;
        if ((TBlockStream *)0x8040000 < pStream) {
          __assert_fail("FileSize <= BLOCK4_MAX_FSIZE",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Qartar[P]CascLibPlus/lib/CascLib/src/common/FileStream.cpp"
                        ,0x8f3,"TFileStream *Block4Stream_Open(const TCHAR *, DWORD)");
        }
        BlockCount = (ulong)pStream % 0x4020;
        FileSize = (ulong)pStream / 0x4020;
        ((TFileStream *)szNameBuff)->StreamSize =
             FileSize * 0x4000 + ((TFileStream *)szNameBuff)->StreamSize;
        *(int *)&((TFileStream *)((long)szNameBuff + 0xd0))->StreamGetPos =
             (int)FileSize + *(int *)&((TFileStream *)((long)szNameBuff + 0xd0))->StreamGetPos;
        if (pStream < (TBlockStream *)0x8040000) {
          if (BlockCount != 0) {
            ((TFileStream *)szNameBuff)->StreamSize =
                 (BlockCount - 0x20) + ((TFileStream *)szNameBuff)->StreamSize;
            *(int *)&((TFileStream *)((long)szNameBuff + 0xd0))->StreamGetPos =
                 *(int *)&((TFileStream *)((long)szNameBuff + 0xd0))->StreamGetPos + 1;
          }
          break;
        }
      }
      *(int *)&((TFileStream *)((long)szNameBuff + 0xd0))->StreamGetSize = nSuffix;
      *(undefined4 *)((long)&((TFileStream *)((long)szNameBuff + 0xd0))->StreamGetSize + 4) = 0x4000
      ;
      *(undefined4 *)((long)&((TFileStream *)((long)szNameBuff + 0xd0))->StreamGetPos + 4) = 1;
      *(undefined4 *)&((TFileStream *)((long)szNameBuff + 0xd0))->StreamClose = 0;
      ((TFileStream *)szNameBuff)->StreamPos = 0;
      ((TFileStream *)szNameBuff)->dwFlags = ((TFileStream *)szNameBuff)->dwFlags | 0x100;
      free(__s);
    }
    if (nSuffix == 0) {
      FileStream_Close((TFileStream *)szNameBuff);
      SetLastError(2);
      szNameBuff = (TCHAR *)0x0;
    }
    szFileName_local = szNameBuff;
  }
  return (TFileStream *)szFileName_local;
}

Assistant:

static TFileStream * Block4Stream_Open(const TCHAR * szFileName, DWORD dwStreamFlags)
{
    TBaseProviderData * NewBaseArray = NULL;
    ULONGLONG RemainderBlock;
    ULONGLONG BlockCount;
    ULONGLONG FileSize;
    TBlockStream * pStream;
    TCHAR * szNameBuff;
    size_t nNameLength;
    DWORD dwBaseFiles = 0;
    DWORD dwBaseFlags;

    // Create new empty stream
    pStream = (TBlockStream *)AllocateFileStream(szFileName, sizeof(TBlockStream), dwStreamFlags);
    if(pStream == NULL)
        return NULL;

    // Sanity check
    assert(pStream->BaseOpen != NULL);

    // Get the length of the file name without numeric suffix
    nNameLength = _tcslen(pStream->szFileName);
    if(pStream->szFileName[nNameLength - 2] == '.' && pStream->szFileName[nNameLength - 1] == '0')
        nNameLength -= 2;
    pStream->szFileName[nNameLength] = 0;

    // Supply the stream functions
    pStream->StreamRead    = (STREAM_READ)BlockStream_Read;
    pStream->StreamGetSize = BlockStream_GetSize;
    pStream->StreamGetPos  = BlockStream_GetPos;
    pStream->StreamClose   = (STREAM_CLOSE)Block4Stream_Close;
    pStream->BlockRead     = (BLOCK_READ)Block4Stream_BlockRead;

    // Allocate work space for numeric names
    szNameBuff = CASC_ALLOC(TCHAR, nNameLength + 4);
    if(szNameBuff != NULL)
    {
        // Set the base flags
        dwBaseFlags = (dwStreamFlags & STREAM_PROVIDERS_MASK) | STREAM_FLAG_READ_ONLY;

        // Go all suffixes from 0 to 30
        for(int nSuffix = 0; nSuffix < 30; nSuffix++)
        {
            // Open the n-th file
            _stprintf(szNameBuff, _T("%s.%u"), pStream->szFileName, nSuffix);
            if(!pStream->BaseOpen(pStream, szNameBuff, dwBaseFlags))
                break;

            // If the open succeeded, we re-allocate the base provider array
            NewBaseArray = CASC_ALLOC(TBaseProviderData, dwBaseFiles + 1);
            if(NewBaseArray == NULL)
            {
                SetLastError(ERROR_NOT_ENOUGH_MEMORY);
                return NULL;
            }

            // Copy the old base data array to the new base data array
            if(pStream->FileBitmap != NULL)
            {
                memcpy(NewBaseArray, pStream->FileBitmap, sizeof(TBaseProviderData) * dwBaseFiles);
                CASC_FREE(pStream->FileBitmap);
            }

            // Also copy the opened base array
            memcpy(NewBaseArray + dwBaseFiles, &pStream->Base, sizeof(TBaseProviderData));
            pStream->FileBitmap = NewBaseArray;
            dwBaseFiles++;

            // Get the size of the base stream
            pStream->BaseGetSize(pStream, &FileSize);
            assert(FileSize <= BLOCK4_MAX_FSIZE);
            RemainderBlock = FileSize % (BLOCK4_BLOCK_SIZE + BLOCK4_HASH_SIZE);
            BlockCount = FileSize / (BLOCK4_BLOCK_SIZE + BLOCK4_HASH_SIZE);

            // Increment the stream size and number of blocks
            pStream->StreamSize += (BlockCount * BLOCK4_BLOCK_SIZE);
            pStream->BlockCount += (DWORD)BlockCount;

            // Is this the last file?
            if(FileSize < BLOCK4_MAX_FSIZE)
            {
                if(RemainderBlock)
                {
                    pStream->StreamSize += (RemainderBlock - BLOCK4_HASH_SIZE);
                    pStream->BlockCount++;
                }
                break;
            }
        }

        // Fill the remainining block stream variables
        pStream->BitmapSize = dwBaseFiles;
        pStream->BlockSize  = BLOCK4_BLOCK_SIZE;
        pStream->IsComplete = 1;
        pStream->IsModified = 0;

        // Fill the remaining stream variables
        pStream->StreamPos = 0;
        pStream->dwFlags |= STREAM_FLAG_READ_ONLY;

        CASC_FREE(szNameBuff);
    }

    // If we opened something, return success
    if(dwBaseFiles == 0)
    {
        FileStream_Close(pStream);
        SetLastError(ERROR_FILE_NOT_FOUND);
        pStream = NULL;
    }

    return pStream;
}